

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::chi_square_dist<double>::operator()(chi_square_dist<double> *this,lcg64_shift *r)

{
  ulong uVar1;
  double dVar2;
  
  uVar1 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar1;
  uVar1 = uVar1 >> 0x11 ^ uVar1;
  uVar1 = uVar1 << 0x1f ^ uVar1;
  dVar2 = math::detail::inv_GammaP<double>
                    ((double)(this->P).nu_ * 0.5,
                     (double)(uVar1 >> 1 ^ uVar1 >> 9) * 1.0842021724855042e-19);
  return dVar2 + dVar2;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformco<result_type>(r));
    }